

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmparse.c
# Opt level: O2

long yytnamerr(char *yyres,char *yystr)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (*yystr != '\"') {
LAB_001091a4:
    if (yyres != (char *)0x0) {
      pcVar4 = stpcpy(yyres,yystr);
      return (long)pcVar4 - (long)yyres;
    }
    sVar3 = strlen(yystr);
    return sVar3;
  }
  lVar2 = 0;
  pcVar4 = yystr;
  do {
    cVar1 = pcVar4[1];
    if (cVar1 == '\\') {
      if (pcVar4[2] != '\\') goto LAB_001091a4;
      pcVar4 = pcVar4 + 2;
    }
    else {
      if (cVar1 == '\"') {
        if (yyres == (char *)0x0) {
          return lVar2;
        }
        yyres[lVar2] = '\0';
        return lVar2;
      }
      if ((cVar1 == '\'') || (cVar1 == ',')) goto LAB_001091a4;
      pcVar4 = pcVar4 + 1;
    }
    if (yyres != (char *)0x0) {
      yyres[lVar2] = cVar1;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static YYPTRDIFF_T
yytnamerr (char *yyres, const char *yystr)
{
  if (*yystr == '"')
    {
      YYPTRDIFF_T yyn = 0;
      char const *yyp = yystr;
      for (;;)
        switch (*++yyp)
          {
          case '\'':
          case ',':
            goto do_not_strip_quotes;

          case '\\':
            if (*++yyp != '\\')
              goto do_not_strip_quotes;
            else
              goto append;

          append:
          default:
            if (yyres)
              yyres[yyn] = *yyp;
            yyn++;
            break;

          case '"':
            if (yyres)
              yyres[yyn] = '\0';
            return yyn;
          }
    do_not_strip_quotes: ;
    }

  if (yyres)
    return yystpcpy (yyres, yystr) - yyres;
  else
    return yystrlen (yystr);
}